

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_cleanup(Curl_multi *multi)

{
  Curl_llist_node *pCVar1;
  void *p;
  Curl_easy *data;
  CURLMcode CVar2;
  
  CVar2 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) {
    if ((multi->field_0x279 & 4) == 0) {
      pCVar1 = Curl_llist_head(&multi->msgsent);
      for (; pCVar1 != (Curl_llist_node *)0x0; pCVar1 = Curl_node_next(pCVar1)) {
        p = Curl_node_elem(pCVar1);
        if (p != (void *)0x0) {
          Curl_node_remove((Curl_llist_node *)((long)p + 0x20));
          Curl_llist_append(&multi->process,p,(Curl_llist_node *)((long)p + 0x20));
        }
      }
      process_pending_handles(multi);
      pCVar1 = Curl_llist_head(&multi->process);
      while (pCVar1 != (Curl_llist_node *)0x0) {
        data = (Curl_easy *)Curl_node_elem(pCVar1);
        if (data == (Curl_easy *)0x0) {
          return CURLM_BAD_HANDLE;
        }
        if (data->magic != 0xc0dedbad) {
          return CURLM_BAD_HANDLE;
        }
        pCVar1 = Curl_node_next(pCVar1);
        if ((((data->state).field_0x775 & 4) == 0) && (data->conn != (connectdata *)0x0)) {
          multi_done(data,CURLE_OK,true);
        }
        if ((data->dns).hostcachetype == HCACHE_MULTI) {
          Curl_hostcache_clean(data,(data->dns).hostcache);
          (data->dns).hostcache = (Curl_hash *)0x0;
          (data->dns).hostcachetype = HCACHE_NONE;
        }
        data->multi = (Curl_multi *)0x0;
        if (data->psl == &multi->psl) {
          data->psl = (PslCache *)0x0;
        }
      }
      Curl_cpool_destroy(&multi->cpool);
      multi->magic = 0;
      sockhash_destroy(&multi->sockhash);
      Curl_hash_destroy(&multi->proto_hash);
      Curl_hash_destroy(&multi->hostcache);
      Curl_psl_destroy(&multi->psl);
      close(multi->wakeup_pair[0]);
      close(multi->wakeup_pair[1]);
      multi_xfer_bufs_free(multi);
      (*Curl_cfree)(multi);
      CVar2 = CURLM_OK;
    }
    else {
      CVar2 = CURLM_RECURSIVE_API_CALL;
    }
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_cleanup(struct Curl_multi *multi)
{
  if(GOOD_MULTI_HANDLE(multi)) {
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;
    if(multi->in_callback)
      return CURLM_RECURSIVE_API_CALL;

    /* move the pending and msgsent entries back to process
       so that there is just one list to iterate over */
    unlink_all_msgsent_handles(multi);
    process_pending_handles(multi);

    /* First remove all remaining easy handles */
    for(e = Curl_llist_head(&multi->process); e; e = n) {
      struct Curl_easy *data = Curl_node_elem(e);

      if(!GOOD_EASY_HANDLE(data))
        return CURLM_BAD_HANDLE;

      n = Curl_node_next(e);
      if(!data->state.done && data->conn)
        /* if DONE was never called for this handle */
        (void)multi_done(data, CURLE_OK, TRUE);
      if(data->dns.hostcachetype == HCACHE_MULTI) {
        /* clear out the usage of the shared DNS cache */
        Curl_hostcache_clean(data, data->dns.hostcache);
        data->dns.hostcache = NULL;
        data->dns.hostcachetype = HCACHE_NONE;
      }

      data->multi = NULL; /* clear the association */

#ifdef USE_LIBPSL
      if(data->psl == &multi->psl)
        data->psl = NULL;
#endif
    }

    Curl_cpool_destroy(&multi->cpool);

    multi->magic = 0; /* not good anymore */

    sockhash_destroy(&multi->sockhash);
    Curl_hash_destroy(&multi->proto_hash);
    Curl_hash_destroy(&multi->hostcache);
    Curl_psl_destroy(&multi->psl);

#ifdef USE_WINSOCK
    WSACloseEvent(multi->wsa_event);
#else
#ifdef ENABLE_WAKEUP
    wakeup_close(multi->wakeup_pair[0]);
#ifndef USE_EVENTFD
    wakeup_close(multi->wakeup_pair[1]);
#endif
#endif
#endif

    multi_xfer_bufs_free(multi);
    free(multi);

    return CURLM_OK;
  }
  return CURLM_BAD_HANDLE;
}